

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int archive_compressor_zstd_open(archive_write_filter *f)

{
  undefined4 *puVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *fmt;
  archive *a;
  ulong __size;
  
  puVar1 = (undefined4 *)f->data;
  if (*(long *)(puVar1 + 0x18) == 0) {
    uVar3 = ZSTD_CStreamOutSize();
    __size = uVar3;
    if (f->archive->magic == 0xb0c5c0de) {
      iVar2 = archive_write_get_bytes_per_block(f->archive);
      uVar6 = (ulong)iVar2;
      __size = uVar6;
      if ((uVar6 <= uVar3) && (__size = uVar3, iVar2 != 0)) {
        __size = uVar3 - uVar3 % uVar6;
      }
    }
    *(ulong *)(puVar1 + 0x1a) = __size;
    *(undefined8 *)(puVar1 + 0x1c) = 0;
    pvVar4 = malloc(__size);
    *(void **)(puVar1 + 0x18) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      a = f->archive;
      fmt = "Can\'t allocate data for compression buffer";
      iVar2 = 0xc;
      goto LAB_00269cc0;
    }
  }
  f->write = archive_compressor_zstd_write;
  uVar5 = ZSTD_initCStream(*(undefined8 *)(puVar1 + 0x16),*puVar1);
  iVar2 = ZSTD_isError(uVar5);
  if (iVar2 == 0) {
    ZSTD_CCtx_setParameter(*(undefined8 *)(puVar1 + 0x16),400,puVar1[1]);
    ZSTD_CCtx_setParameter(*(undefined8 *)(puVar1 + 0x16),0x65,puVar1[2]);
    return 0;
  }
  a = f->archive;
  fmt = "Internal error initializing zstd compressor object";
  iVar2 = -1;
LAB_00269cc0:
  archive_set_error(a,iVar2,fmt);
  return -0x1e;
}

Assistant:

static int
archive_compressor_zstd_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;

	if (data->out.dst == NULL) {
		size_t bs = ZSTD_CStreamOutSize(), bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of
			 * the of bytes per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->out.size = bs;
		data->out.pos = 0;
		data->out.dst = malloc(data->out.size);
		if (data->out.dst == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_zstd_write;

	if (ZSTD_isError(ZSTD_initCStream(data->cstream,
	    data->compression_level))) {
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing zstd compressor object");
		return (ARCHIVE_FATAL);
	}

	ZSTD_CCtx_setParameter(data->cstream, ZSTD_c_nbWorkers, data->threads);

#if ZSTD_VERSION_NUMBER >= MINVER_LONG
	ZSTD_CCtx_setParameter(data->cstream, ZSTD_c_windowLog, data->long_distance);
#endif

	return (ARCHIVE_OK);
}